

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void compact_int32_suite::test_array64_int32(void)

{
  view_type *pvVar1;
  const_iterator pvVar2;
  const_iterator pvVar3;
  undefined4 local_88;
  value local_84 [2];
  undefined8 local_7c;
  value_type expected [8];
  undefined4 local_68;
  value local_64 [2];
  undefined4 local_5c;
  value local_58 [2];
  undefined1 local_50 [8];
  decoder decoder;
  value_type input [17];
  
  decoder.current.view._M_str = (uchar *)0x8dc;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[17]>
            ((decoder *)local_50,(uchar (*) [17])&decoder.current.view._M_str);
  local_58[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_50);
  local_5c = 0xdc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::array64_int32",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x999,"void compact_int32_suite::test_array64_int32()",local_58,&local_5c);
  local_64[0] = trial::protocol::bintoken::detail::decoder::symbol((decoder *)local_50);
  local_68 = 7;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x99a,"void compact_int32_suite::test_array64_int32()",local_64,&local_68);
  expected._4_4_ = trial::protocol::bintoken::detail::decoder::category((decoder *)local_50);
  expected[0] = '\x02';
  expected[1] = '\0';
  expected[2] = '\0';
  expected[3] = '\0';
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x99b,"void compact_int32_suite::test_array64_int32()",expected + 4,expected);
  local_7c = 0x8877665544332211;
  pvVar1 = trial::protocol::bintoken::detail::decoder::literal((decoder *)local_50);
  pvVar2 = std::
           basic_string_view<unsigned_char,_trial::protocol::core::detail::char_traits<unsigned_char>_>
           ::begin(pvVar1);
  pvVar1 = trial::protocol::bintoken::detail::decoder::literal((decoder *)local_50);
  pvVar3 = std::
           basic_string_view<unsigned_char,_trial::protocol::core::detail::char_traits<unsigned_char>_>
           ::end(pvVar1);
  boost::detail::
  test_all_with_impl<std::ostream,unsigned_char_const*,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x9a2,"void compact_int32_suite::test_array64_int32()",pvVar2,pvVar3,&local_7c,
             expected);
  trial::protocol::bintoken::detail::decoder::next((decoder *)local_50);
  local_84[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_50);
  local_88 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x9a4,"void compact_int32_suite::test_array64_int32()",local_84,&local_88);
  return;
}

Assistant:

void test_array64_int32()
{
    const value_type input[] = { token::code::array64_int32, 0x08, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::array64_int32);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::data);
    const value_type expected[] = {
        0x11, 0x22, 0x33, 0x44,
        0x55, 0x66, 0x77, 0x88
    };
    TRIAL_PROTOCOL_TEST_ALL_WITH(decoder.literal().begin(), decoder.literal().end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<value_type>());
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}